

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::compareEqual<char[28],std::basic_string_view<char,std::char_traits<char>>>
               (char (*lhs) [28],basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  char *in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  __x._M_str = unaff_retaddr;
  __x._M_len = in_RDI;
  __y._M_str = in_RSI;
  __y._M_len = in_stack_ffffffffffffffe8;
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }